

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test::testBody
          (TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test *this)

{
  UtestShell *test;
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_138;
  undefined1 local_128 [8];
  MockNoWayToCopyCustomTypeFailure failure;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40 [2];
  MockNamedValueCopier local_20;
  DummyCopier copier;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockPlugin_installCopierRecordsTheCopierButNotInstallsItYet_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier + 7));
  DummyCopier::DummyCopier((DummyCopier *)&local_20);
  SimpleString::SimpleString(local_40,"myType");
  MockSupportPlugin::installCopier
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,local_40,&local_20);
  SimpleString::~SimpleString(local_40);
  SimpleString::SimpleString(&local_50,"");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_60,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_60);
  SimpleString::SimpleString(&local_70,"myType");
  SimpleString::SimpleString(&local_80,"name");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_70,&local_80,0);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a0);
  SimpleString::SimpleString(&local_b0,"myType");
  SimpleString::SimpleString
            ((SimpleString *)&failure.super_MockFailure.super_TestFailure.message_.bufferSize_,
             "name");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_b0,
             &failure.super_MockFailure.super_TestFailure.message_.bufferSize_,0);
  SimpleString::~SimpleString
            ((SimpleString *)&failure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  test = (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test;
  SimpleString::SimpleString(&local_138,"myType");
  MockNoWayToCopyCustomTypeFailure::MockNoWayToCopyCustomTypeFailure
            ((MockNoWayToCopyCustomTypeFailure *)local_128,test,&local_138);
  SimpleString::~SimpleString(&local_138);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_128,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x8b);
  MockSupportPlugin::clear(&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin);
  MockNoWayToCopyCustomTypeFailure::~MockNoWayToCopyCustomTypeFailure
            ((MockNoWayToCopyCustomTypeFailure *)local_128);
  DummyCopier::~DummyCopier((DummyCopier *)&local_20);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&copier.super_MockNamedValueCopier._vptr_MockNamedValueCopier + 7));
  return;
}

Assistant:

TEST(MockPlugin, installCopierRecordsTheCopierButNotInstallsItYet)
{
    MockFailureReporterInstaller failureReporterInstaller;

    DummyCopier copier;
    plugin.installCopier("myType", copier);
    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("myType", "name", NULLPTR);
    mock().actualCall("foo").withOutputParameterOfType("myType", "name", NULLPTR);

    MockNoWayToCopyCustomTypeFailure failure(test, "myType");
    CHECK_EXPECTED_MOCK_FAILURE(failure);

    plugin.clear();
}